

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

void Llb_Nonlin4SetupVarMap(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  DdNode **x;
  DdNode **y;
  ulong uVar4;
  DdNode *pDVar5;
  ulong uVar6;
  long lVar7;
  
  iVar3 = Cudd_ReadSize(dd);
  x = (DdNode **)malloc((long)iVar3 << 3);
  iVar3 = Cudd_ReadSize(dd);
  y = (DdNode **)malloc((long)iVar3 << 3);
  iVar3 = pAig->nRegs;
  if (0 < iVar3) {
    lVar7 = 0;
    do {
      uVar6 = (ulong)(uint)pAig->nTruePos + lVar7;
      iVar3 = (int)uVar6;
      if ((iVar3 < 0) || (pAig->vCos->nSize <= iVar3)) {
LAB_0082a661:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar4 = (ulong)(uint)pAig->nTruePis + lVar7;
      iVar3 = (int)uVar4;
      if ((iVar3 < 0) || (pAig->vCis->nSize <= iVar3)) goto LAB_0082a661;
      iVar3 = *(int *)((long)pAig->vCos->pArray[uVar6 & 0xffffffff] + 0x24);
      if (((long)iVar3 < 0) || (vOrder->nSize <= iVar3)) {
LAB_0082a642:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = vOrder->pArray[iVar3];
      if (iVar3 < 0) {
        __assert_fail("Llb_ObjBddVar(vOrder, pObjLo) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Nonlin.c"
                      ,0x1aa,"void Llb_Nonlin4SetupVarMap(DdManager *, Aig_Man_t *, Vec_Int_t *)");
      }
      pvVar2 = pAig->vCis->pArray[uVar4 & 0xffffffff];
      iVar1 = *(int *)((long)pvVar2 + 0x24);
      if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) goto LAB_0082a642;
      if (vOrder->pArray[iVar1] < 0) {
        __assert_fail("Llb_ObjBddVar(vOrder, pObjLi) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Nonlin.c"
                      ,0x1ab,"void Llb_Nonlin4SetupVarMap(DdManager *, Aig_Man_t *, Vec_Int_t *)");
      }
      pDVar5 = Cudd_bddIthVar(dd,iVar3);
      x[lVar7] = pDVar5;
      iVar3 = *(int *)((long)pvVar2 + 0x24);
      if (((long)iVar3 < 0) || (vOrder->nSize <= iVar3)) goto LAB_0082a642;
      pDVar5 = Cudd_bddIthVar(dd,vOrder->pArray[iVar3]);
      y[lVar7] = pDVar5;
      lVar7 = lVar7 + 1;
      iVar3 = pAig->nRegs;
    } while (lVar7 < iVar3);
  }
  Cudd_SetVarMap(dd,x,y,iVar3);
  if (x != (DdNode **)0x0) {
    free(x);
  }
  if (y == (DdNode **)0x0) {
    return;
  }
  free(y);
  return;
}

Assistant:

void Llb_Nonlin4SetupVarMap( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder )
{
    DdNode ** pVarsX, ** pVarsY;
    Aig_Obj_t * pObjLo, * pObjLi;
    int i;
    pVarsX = ABC_ALLOC( DdNode *, Cudd_ReadSize(dd) );
    pVarsY = ABC_ALLOC( DdNode *, Cudd_ReadSize(dd) );
    Saig_ManForEachLiLo( pAig, pObjLo, pObjLi, i )
    {
        assert( Llb_ObjBddVar(vOrder, pObjLo) >= 0 );
        assert( Llb_ObjBddVar(vOrder, pObjLi) >= 0 );
        pVarsX[i] = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObjLo) );
        pVarsY[i] = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObjLi) );
    }
    Cudd_SetVarMap( dd, pVarsX, pVarsY, Aig_ManRegNum(pAig) );
    ABC_FREE( pVarsX );
    ABC_FREE( pVarsY );
}